

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O2

void testing::internal::ContainerPrinter::
     PrintValue<std::unordered_multiset<int,std::hash<int>,std::equal_to<int>,std::allocator<int>>,void>
               (unordered_multiset<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>
                *container,ostream *os)

{
  long lVar1;
  __node_base *p_Var2;
  
  std::operator<<(os,'{');
  p_Var2 = &(container->_M_h)._M_before_begin;
  lVar1 = 0;
  do {
    p_Var2 = p_Var2->_M_nxt;
    if (p_Var2 == (__node_base *)0x0) {
      if (lVar1 != 0) {
LAB_001d8c34:
        std::operator<<(os,' ');
      }
      std::operator<<(os,'}');
      return;
    }
    if ((lVar1 != 0) && (std::operator<<(os,','), lVar1 == 0x20)) {
      std::operator<<(os," ...");
      goto LAB_001d8c34;
    }
    std::operator<<(os,' ');
    internal_stream_operator_without_lexical_name_lookup::StreamPrinter::
    PrintValue<int,void,std::ostream&>((int *)(p_Var2 + 1),os);
    lVar1 = lVar1 + 1;
  } while( true );
}

Assistant:

static void PrintValue(const T& container, std::ostream* os) {
    const size_t kMaxCount = 32;  // The maximum number of elements to print.
    *os << '{';
    size_t count = 0;
    for (auto&& elem : container) {
      if (count > 0) {
        *os << ',';
        if (count == kMaxCount) {  // Enough has been printed.
          *os << " ...";
          break;
        }
      }
      *os << ' ';
      // We cannot call PrintTo(elem, os) here as PrintTo() doesn't
      // handle `elem` being a native array.
      internal::UniversalPrint(elem, os);
      ++count;
    }

    if (count > 0) {
      *os << ' ';
    }
    *os << '}';
  }